

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

void __thiscall
helics::FirewallFilterOperation::FirewallFilterOperation(FirewallFilterOperation *this)

{
  cow_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
  *in_RDI;
  cow_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
  *__args;
  
  __args = in_RDI;
  FilterOperations::FilterOperations((FilterOperations *)in_RDI);
  (in_RDI->m_data).m_left.
  super___shared_ptr<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&PTR__FirewallFilterOperation_00a65640;
  std::
  make_shared<helics::FirewallOperator,helics::FirewallFilterOperation::FirewallFilterOperation()::__0>
            ((anon_class_8_1_8991fb9c *)__args);
  gmlc::libguarded::
  cow_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
  ::cow_guarded<>(in_RDI);
  gmlc::libguarded::
  cow_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
  ::cow_guarded<>(in_RDI);
  return;
}

Assistant:

FirewallFilterOperation::FirewallFilterOperation():
    op(std::make_shared<FirewallOperator>(
        [this](const Message* mess) { return allowPassed(mess); }))
{
}